

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_fmt_conv.c
# Opt level: O0

IHEVCD_ERROR_T
ihevcd_fmt_conv(codec_t *ps_codec,process_ctxt_t *ps_proc,UWORD8 *pu1_y_dst,UWORD8 *pu1_u_dst,
               UWORD8 *pu1_v_dst,WORD32 cur_row,WORD32 num_rows)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long *plVar7;
  byte bVar8;
  long lVar9;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  bool bVar10;
  bool bVar11;
  int in_stack_00000008;
  WORD32 num_cols;
  WORD32 i_1;
  UWORD32 ctb_in_row;
  WORD32 last_ctb_y;
  WORD32 last_row;
  WORD32 status;
  UWORD8 *pu1_buf;
  WORD32 idx;
  WORD32 diff;
  WORD32 i;
  WORD32 crop_unit_y;
  WORD32 crop_unit_x;
  WORD32 disable_luma_copy;
  sps_t *ps_sps;
  UWORD8 *pu1_chroma;
  UWORD8 *pu1_luma;
  WORD32 is_u_first;
  UWORD32 *pu4_rgb_dst_tmp;
  UWORD16 *pu2_rgb_dst_tmp;
  UWORD8 *pu1_v_dst_tmp;
  UWORD8 *pu1_u_dst_tmp;
  UWORD8 *pu1_uv_dst_tmp;
  UWORD8 *pu1_y_dst_tmp;
  UWORD8 *pu1_uv_src;
  UWORD8 *pu1_y_src;
  pic_buf_t *ps_disp_pic;
  IHEVCD_ERROR_T ret;
  int local_12c;
  int local_128;
  int local_fc;
  uint local_f8;
  int local_d8;
  int local_d4;
  int local_d0;
  void *local_80;
  void *local_70;
  long local_58;
  long local_50;
  
  if (in_stack_00000008 != 0) {
    lVar6 = *(long *)(in_RSI + 0x38);
    local_d0 = 1;
    local_d4 = 1;
    if (*(char *)(lVar6 + 0xf) == '\x01') {
      local_d0 = 2;
      local_d4 = 2;
    }
    plVar7 = *(long **)(in_RDI + 0x170);
    bVar10 = *(int *)(in_RDI + 0x40) == 0xb;
    bVar11 = *(int *)(in_RDI + 0x38) == 1;
    local_70 = (void *)(*plVar7 + (long)(*(int *)(in_RDI + 0x14) * (int)*(short *)(lVar6 + 8) *
                                         local_d4 + *(short *)(lVar6 + 4) * local_d0) +
                       (long)(in_R9D * *(int *)(in_RDI + 0x14)));
    lVar9 = plVar7[1] +
            (long)(*(int *)(in_RDI + 0x14) * (int)*(short *)(lVar6 + 8) + *(short *)(lVar6 + 4) * 2)
            + (long)((in_R9D / 2) * *(int *)(in_RDI + 0x14));
    local_58 = in_R8;
    local_50 = in_RCX;
    if ((*(int *)(in_RDI + 0x38) == 1) && (*(int *)(in_RDI + 0x3c) == 1)) {
      for (local_d8 = 0; local_d8 < *(int *)(in_RDI + 0x106b0); local_d8 = local_d8 + 1) {
        if ((int)*plVar7 - (int)*(undefined8 *)(in_RDI + (long)local_d8 * 0x308 + 0x44b8) ==
            *(int *)(in_RDI + 0x14) * 0x50 + 0x50) {
          local_50 = *(long *)(in_RDI + (long)local_d8 * 0x308 + 0x44c0) +
                     (long)((*(int *)(in_RDI + 0x14) * 0x50) / 4 + 0x28);
          local_58 = *(long *)(in_RDI + (long)local_d8 * 0x308 + 0x44c8) +
                     (long)((*(int *)(in_RDI + 0x14) * 0x50) / 4 + 0x28);
          break;
        }
      }
    }
    iVar1 = *(int *)(in_RDI + 0x10);
    iVar2 = *(int *)(in_RDI + 0x10);
    local_80 = (void *)(in_RDX + in_R9D * *(int *)(in_RDI + 0x10));
    iVar3 = *(int *)(in_RDI + 0x10);
    iVar4 = *(int *)(in_RDI + 0x10);
    iVar5 = *(int *)(in_RDI + 0x10);
    if (((*(int *)(in_RDI + 100) == 0) && (*(int *)(in_RDI + 0x168) == *(int *)(in_RSI + 0x178))) &&
       (1 < *(int *)(in_RDI + 0x18))) {
      while( true ) {
        if (1 << (*(byte *)(lVar6 + 0xdc0) & 0x1f) < in_stack_00000008) {
          local_128 = in_stack_00000008;
        }
        else {
          local_128 = 1 << (*(byte *)(lVar6 + 0xdc0) & 0x1f);
        }
        local_12c = (in_R9D + local_128 + *(short *)(lVar6 + 8) * local_d4 >>
                    (*(byte *)(lVar6 + 0xdc0) & 0x1f)) + 1;
        if (*(short *)(lVar6 + 0xdc4) + -1 <= local_12c) {
          local_12c = *(short *)(lVar6 + 0xdc4) + -1;
        }
        bVar8 = 1;
        for (local_f8 = 0; (int)local_f8 < (int)*(short *)(lVar6 + 0xdc2); local_f8 = local_f8 + 1)
        {
          bVar8 = *(byte *)(*(long *)(in_RDI + 0xf8) + (long)(local_12c * *(short *)(lVar6 + 0xdc2))
                           + (ulong)local_f8) & bVar8;
        }
        if (bVar8 != 0) break;
        ithread_yield();
      }
    }
    if ((*(int *)(in_RDI + 0x3c) == 0xb) || (*(int *)(in_RDI + 0x3c) == 0xc)) {
      (**(code **)(in_RDI + 0x4488))
                (local_70,lVar9,local_80,local_50 + (in_R9D / 2) * iVar3,*(undefined4 *)(in_RDI + 8)
                 ,in_stack_00000008,*(undefined4 *)(in_RDI + 0x14),*(undefined4 *)(in_RDI + 0x14),
                 *(undefined4 *)(in_RDI + 0x10),*(undefined4 *)(in_RDI + 0x10));
    }
    else if (*(int *)(in_RDI + 0x3c) == 1) {
      if (!bVar11) {
        iVar1 = *(int *)(in_RDI + 8);
        for (local_fc = 0; local_fc < in_stack_00000008; local_fc = local_fc + 1) {
          memcpy(local_80,local_70,(long)iVar1);
          local_80 = (void *)((long)local_80 + (long)*(int *)(in_RDI + 0x10));
          local_70 = (void *)((long)local_70 + (long)*(int *)(in_RDI + 0x14));
        }
        bVar11 = true;
      }
      (**(code **)(in_RDI + 0x4490))
                (local_70,lVar9,local_80,local_50 + ((in_R9D / 2) * iVar4) / 2,
                 local_58 + ((in_R9D / 2) * iVar5) / 2,*(undefined4 *)(in_RDI + 8),in_stack_00000008
                 ,*(undefined4 *)(in_RDI + 0x14),*(undefined4 *)(in_RDI + 0x14),
                 *(undefined4 *)(in_RDI + 0x10),*(int *)(in_RDI + 0x10) / 2,bVar10,bVar11);
    }
    else if (*(int *)(in_RDI + 0x3c) == 9) {
      (**(code **)(in_RDI + 0x4480))
                (local_70,lVar9,in_RDX + (long)(in_R9D * iVar1) * 2,*(undefined4 *)(in_RDI + 8),
                 in_stack_00000008,*(undefined4 *)(in_RDI + 0x14),*(undefined4 *)(in_RDI + 0x14),
                 *(undefined4 *)(in_RDI + 0x10),bVar10);
    }
    else if (*(int *)(in_RDI + 0x3c) == 0xd) {
      if (!bVar10) {
        __assert_fail("(is_u_first == 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_fmt_conv.c"
                      ,0x379,
                      "IHEVCD_ERROR_T ihevcd_fmt_conv(codec_t *, process_ctxt_t *, UWORD8 *, UWORD8 *, UWORD8 *, WORD32, WORD32)"
                     );
      }
      (**(code **)(in_RDI + 0x4478))
                (local_70,lVar9,in_RDX + (long)(in_R9D * iVar2) * 4,*(undefined4 *)(in_RDI + 8),
                 in_stack_00000008,*(undefined4 *)(in_RDI + 0x14),*(undefined4 *)(in_RDI + 0x14),
                 *(undefined4 *)(in_RDI + 0x10),1);
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T ihevcd_fmt_conv(codec_t *ps_codec,
                               process_ctxt_t *ps_proc,
                               UWORD8 *pu1_y_dst,
                               UWORD8 *pu1_u_dst,
                               UWORD8 *pu1_v_dst,
                               WORD32 cur_row,
                               WORD32 num_rows)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    pic_buf_t *ps_disp_pic;
    UWORD8 *pu1_y_src, *pu1_uv_src;
    UWORD8 *pu1_y_dst_tmp, *pu1_uv_dst_tmp;
    UWORD8 *pu1_u_dst_tmp, *pu1_v_dst_tmp;
    UWORD16 *pu2_rgb_dst_tmp;
    UWORD32 *pu4_rgb_dst_tmp;
    WORD32 is_u_first;
    UWORD8 *pu1_luma;
    UWORD8 *pu1_chroma;
    sps_t *ps_sps;
    WORD32 disable_luma_copy;
    WORD32 crop_unit_x, crop_unit_y;

    if(0 == num_rows)
        return ret;

    /* In case processing is disabled, then no need to format convert/copy */
    PROFILE_DISABLE_FMT_CONV();
    ps_sps = ps_proc->ps_sps;

    crop_unit_x = 1;
    crop_unit_y = 1;

    if(CHROMA_FMT_IDC_YUV420 == ps_sps->i1_chroma_format_idc)
    {
        crop_unit_x = 2;
        crop_unit_y = 2;
    }

    ps_disp_pic = ps_codec->ps_disp_buf;
    pu1_luma = ps_disp_pic->pu1_luma;
    pu1_chroma = ps_disp_pic->pu1_chroma;


    /* Take care of cropping */
    pu1_luma    += ps_codec->i4_strd * ps_sps->i2_pic_crop_top_offset * crop_unit_y + ps_sps->i2_pic_crop_left_offset * crop_unit_x;

    /* Left offset is multiplied by 2 because buffer is UV interleaved */
    pu1_chroma  += ps_codec->i4_strd * ps_sps->i2_pic_crop_top_offset + ps_sps->i2_pic_crop_left_offset * 2;


    is_u_first = (IV_YUV_420SP_UV == ps_codec->e_ref_chroma_fmt) ? 1 : 0;

    /* In case of 420P output luma copy is disabled for shared mode */
    disable_luma_copy = 0;
    if(1 == ps_codec->i4_share_disp_buf)
    {
        disable_luma_copy = 1;
    }



    {
        pu1_y_src   = pu1_luma + cur_row * ps_codec->i4_strd;
        pu1_uv_src  = pu1_chroma + (cur_row / 2) * ps_codec->i4_strd;

        /* In case of shared mode, with 420P output, get chroma destination */
        if((1 == ps_codec->i4_share_disp_buf) && (IV_YUV_420P == ps_codec->e_chroma_fmt))
        {
            WORD32 i;
            for(i = 0; i < ps_codec->i4_share_disp_buf_cnt; i++)
            {
                WORD32 diff = ps_disp_pic->pu1_luma - ps_codec->s_disp_buffer[i].pu1_bufs[0];
                if(diff == (ps_codec->i4_strd * PAD_TOP + PAD_LEFT))
                {
                    pu1_u_dst = ps_codec->s_disp_buffer[i].pu1_bufs[1];
                    pu1_u_dst += (ps_codec->i4_strd * PAD_TOP) / 4 + (PAD_LEFT / 2);

                    pu1_v_dst = ps_codec->s_disp_buffer[i].pu1_bufs[2];
                    pu1_v_dst += (ps_codec->i4_strd * PAD_TOP) / 4 + (PAD_LEFT / 2);
                    break;
                }
            }
        }
        pu2_rgb_dst_tmp  = (UWORD16 *)pu1_y_dst;
        pu2_rgb_dst_tmp  += cur_row * ps_codec->i4_disp_strd;
        pu4_rgb_dst_tmp  = (UWORD32 *)pu1_y_dst;
        pu4_rgb_dst_tmp  += cur_row * ps_codec->i4_disp_strd;
        pu1_y_dst_tmp  = pu1_y_dst  + cur_row * ps_codec->i4_disp_strd;
        pu1_uv_dst_tmp = pu1_u_dst  + (cur_row / 2) * ps_codec->i4_disp_strd;
        pu1_u_dst_tmp = pu1_u_dst  + (cur_row / 2) * ps_codec->i4_disp_strd / 2;
        pu1_v_dst_tmp = pu1_v_dst  + (cur_row / 2) * ps_codec->i4_disp_strd / 2;

        /* In case of multi threaded implementation, format conversion might be called
         * before reconstruction is completed. If the frame being converted/copied
         * is same as the frame being reconstructed,
         * Check how many rows can be format converted
         * Convert those many rows and then check for remaining rows and so on
         */

        if((0 == ps_codec->i4_flush_mode) && (ps_codec->i4_disp_buf_id == ps_proc->i4_cur_pic_buf_id) && (1 < ps_codec->i4_num_cores))
        {
            WORD32 idx;
            UWORD8 *pu1_buf;
            WORD32 status;
            WORD32 last_row = cur_row + num_rows;
            WORD32 last_ctb_y;
            UWORD32 ctb_in_row;

            while(1)
            {
                last_row = cur_row + MAX(num_rows, (1 << ps_sps->i1_log2_ctb_size)) +
                                ps_sps->i2_pic_crop_top_offset * crop_unit_y;
                last_ctb_y = (last_row >> ps_sps->i1_log2_ctb_size) - 1;
                /* Since deblocking works with a shift of -4, -4 ,wait till next CTB row is processed */
                last_ctb_y++;
                /* In case of a  conformance window, an extra wait of one row might be needed */
                last_ctb_y++;
                last_ctb_y = MIN(last_ctb_y, (ps_sps->i2_pic_ht_in_ctb - 1));

                idx = (last_ctb_y * ps_sps->i2_pic_wd_in_ctb);

                /*Check if the row below is completely processed before proceeding with format conversion*/
                status = 1;
                for(ctb_in_row = 0; (WORD32)ctb_in_row < ps_sps->i2_pic_wd_in_ctb; ctb_in_row++)
                {
                    pu1_buf = (ps_codec->pu1_proc_map + idx + ctb_in_row);
                    status &= *pu1_buf;
                }

                if(status)
                {
                    break;
                }
                else
                {
                    ithread_yield();
                }
            }
        }


        if((IV_YUV_420SP_UV == ps_codec->e_chroma_fmt) || (IV_YUV_420SP_VU == ps_codec->e_chroma_fmt))
        {

            ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_420sp_fptr(pu1_y_src, pu1_uv_src,
                                                                          pu1_y_dst_tmp, pu1_uv_dst_tmp,
                                                                          ps_codec->i4_disp_wd,
                                                                          num_rows,
                                                                          ps_codec->i4_strd,
                                                                          ps_codec->i4_strd,
                                                                          ps_codec->i4_disp_strd,
                                                                          ps_codec->i4_disp_strd);
        }
        else if(IV_YUV_420P == ps_codec->e_chroma_fmt)
        {

            if(0 == disable_luma_copy)
            {
                // copy luma
                WORD32 i;
                WORD32 num_cols = ps_codec->i4_disp_wd;

                for(i = 0; i < num_rows; i++)
                {
                    memcpy(pu1_y_dst_tmp, pu1_y_src, num_cols);
                    pu1_y_dst_tmp += ps_codec->i4_disp_strd;
                    pu1_y_src += ps_codec->i4_strd;
                }

                disable_luma_copy = 1;
            }

            ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_420p_fptr(pu1_y_src, pu1_uv_src,
                                                                         pu1_y_dst_tmp, pu1_u_dst_tmp, pu1_v_dst_tmp,
                                                                         ps_codec->i4_disp_wd,
                                                                         num_rows,
                                                                         ps_codec->i4_strd,
                                                                         ps_codec->i4_strd,
                                                                         ps_codec->i4_disp_strd,
                                                                         (ps_codec->i4_disp_strd / 2),
                                                                         is_u_first,
                                                                         disable_luma_copy);

        }
        else if(IV_RGB_565 == ps_codec->e_chroma_fmt)
        {

            ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_rgb565_fptr(pu1_y_src, pu1_uv_src,
                                                                           pu2_rgb_dst_tmp,
                                                                           ps_codec->i4_disp_wd,
                                                                           num_rows,
                                                                           ps_codec->i4_strd,
                                                                           ps_codec->i4_strd,
                                                                           ps_codec->i4_disp_strd,
                                                                           is_u_first);

        }
        else if(IV_RGBA_8888 == ps_codec->e_chroma_fmt)
        {
            ASSERT(is_u_first == 1);

            ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_rgba8888_fptr(pu1_y_src,
                                                                             pu1_uv_src,
                                                                             pu4_rgb_dst_tmp,
                                                                             ps_codec->i4_disp_wd,
                                                                             num_rows,
                                                                             ps_codec->i4_strd,
                                                                             ps_codec->i4_strd,
                                                                             ps_codec->i4_disp_strd,
                                                                             is_u_first);

        }



    }
    return (ret);
}